

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O3

bool crnlib::image_utils::compute_delta(image_u8 *dest,image_u8 *a,image_u8 *b,uint scale)

{
  short sVar1;
  short sVar2;
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [13];
  undefined1 auVar12 [13];
  bool bVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  bool bVar17;
  color_quad<unsigned_char,_int> cVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  color_quad<unsigned_char,_int> local_24;
  
  if ((a->m_width == b->m_width) && (a->m_height == b->m_height)) {
    image<crnlib::color_quad<unsigned_char,_int>_>::resize
              (dest,a->m_width,a->m_height,0xffffffff,&local_24);
    uVar15 = a->m_height;
    bVar13 = true;
    if (uVar15 != 0) {
      uVar16 = a->m_width;
      uVar14 = 0;
      do {
        bVar17 = uVar16 != 0;
        uVar16 = 0;
        if (bVar17) {
          uVar15 = 0;
          do {
            cVar18.field_0 =
                 (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                 *(anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                  &a->m_pPixels[a->m_pitch * uVar14 + uVar15].field_0.field_0;
            uVar9 = (ulong)cVar18.field_0._0_2_ & 0xffffffffffff00ff;
            auVar3._8_4_ = 0;
            auVar3._0_8_ = uVar9;
            auVar3[0xc] = cVar18.field_0._3_1_;
            auVar4[8] = cVar18.field_0._2_1_;
            auVar4._0_8_ = uVar9;
            auVar4[9] = 0;
            auVar4._10_3_ = auVar3._10_3_;
            auVar11._5_8_ = 0;
            auVar11._0_5_ = auVar4._8_5_;
            auVar5[4] = cVar18.field_0._1_1_;
            auVar5._0_4_ = (int)uVar9;
            auVar5[5] = 0;
            auVar5._6_7_ = SUB137(auVar11 << 0x40,6);
            cVar18.field_0 =
                 (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                 *(anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                  &b->m_pPixels[b->m_pitch * uVar14 + uVar15].field_0.field_0;
            uVar10 = (ulong)cVar18.field_0._0_2_ & 0xffffffffffff00ff;
            auVar6._8_4_ = 0;
            auVar6._0_8_ = uVar10;
            auVar6[0xc] = cVar18.field_0._3_1_;
            auVar7[8] = cVar18.field_0._2_1_;
            auVar7._0_8_ = uVar10;
            auVar7[9] = 0;
            auVar7._10_3_ = auVar6._10_3_;
            auVar12._5_8_ = 0;
            auVar12._0_5_ = auVar7._8_5_;
            auVar8[4] = cVar18.field_0._1_1_;
            auVar8._0_4_ = (int)uVar10;
            auVar8[5] = 0;
            auVar8._6_7_ = SUB137(auVar12 << 0x40,6);
            auVar20._0_4_ = (int)uVar9 - (int)uVar10;
            auVar20._4_4_ = auVar5._4_4_ - auVar8._4_4_;
            auVar20._8_4_ = auVar4._8_4_ - auVar7._8_4_;
            auVar20._12_4_ =
                 (uint)(uint3)(auVar3._10_3_ >> 0x10) - (uint)(uint3)(auVar6._10_3_ >> 0x10);
            auVar21._4_4_ = auVar20._4_4_;
            auVar21._0_4_ = auVar20._4_4_;
            auVar21._8_4_ = auVar20._12_4_;
            auVar21._12_4_ = auVar20._12_4_;
            auVar19._0_4_ = auVar20._0_4_ * scale + 0x80;
            auVar19._4_4_ = auVar20._4_4_ * scale + 0x80;
            auVar19._8_4_ = (int)((auVar20._8_8_ & 0xffffffff) * (ulong)scale) + 0x80;
            auVar19._12_4_ = (int)((auVar21._8_8_ & 0xffffffff) * (ulong)scale) + 0x80;
            auVar20 = packssdw(auVar19,auVar19);
            sVar1 = auVar20._0_2_;
            sVar2 = auVar20._2_2_;
            cVar18.field_0.field_0.g = (0 < sVar2) * (sVar2 < 0x100) * auVar20[2] - (0xff < sVar2);
            cVar18.field_0.field_0.r = (0 < sVar1) * (sVar1 < 0x100) * auVar20[0] - (0xff < sVar1);
            sVar1 = auVar20._4_2_;
            cVar18.field_0.field_0.b = (0 < sVar1) * (sVar1 < 0x100) * auVar20[4] - (0xff < sVar1);
            sVar1 = auVar20._6_2_;
            cVar18.field_0.field_0.a = (0 < sVar1) * (sVar1 < 0x100) * auVar20[6] - (0xff < sVar1);
            dest->m_pPixels[dest->m_pitch * uVar14 + uVar15].field_0 = cVar18.field_0;
            uVar15 = uVar15 + 1;
            uVar16 = a->m_width;
          } while (uVar15 < uVar16);
          uVar15 = a->m_height;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < uVar15);
    }
  }
  else {
    bVar13 = false;
  }
  return bVar13;
}

Assistant:

bool compute_delta(image_u8& dest, image_u8& a, image_u8& b, uint scale) {
  if ((a.get_width() != b.get_width()) || (a.get_height() != b.get_height()))
    return false;

  dest.resize(a.get_width(), b.get_height());

  for (uint y = 0; y < a.get_height(); y++) {
    for (uint x = 0; x < a.get_width(); x++) {
      const color_quad_u8& ca = a(x, y);
      const color_quad_u8& cb = b(x, y);

      color_quad_u8 cd;
      for (uint c = 0; c < 4; c++) {
        int d = (ca[c] - cb[c]) * scale + 128;
        d = math::clamp(d, 0, 255);
        cd[c] = static_cast<uint8>(d);
      }

      dest(x, y) = cd;
    }
  }

  return true;
}